

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_zip_finish_entry(archive_write *a)

{
  undefined1 *puVar1;
  anon_union_256_3_ff98fc32_for_stream *paVar2;
  compression cVar3;
  zip_conflict *zip;
  ulong uVar4;
  int64_t iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  wchar_t wVar10;
  time_t tVar11;
  uchar *puVar12;
  long lVar13;
  sbyte sVar14;
  uchar *p;
  sbyte sVar15;
  sbyte sVar16;
  undefined8 *puVar17;
  ulong uVar18;
  char *pcVar19;
  byte bVar20;
  uchar *p_1;
  size_t sVar21;
  uint32_t *puVar22;
  size_t outl;
  size_t hmac_len;
  undefined2 local_88;
  short sStack_86;
  uint32_t uStack_84;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined8 local_7c;
  undefined8 local_74 [2];
  archive_hmac_sha1_ctx *local_60;
  archive_crypto_ctx *local_58;
  archive_crypto_ctx *local_50;
  trad_enc_ctx *local_48;
  archive_hmac_sha1_ctx *local_40;
  size_t local_38;
  
  zip = (zip_conflict *)a->format_data;
  cVar3 = zip->entry_compression;
  if (cVar3 < COMPRESSION_ZSTD) {
    if (cVar3 == COMPRESSION_DEFLATE) {
      paVar2 = &zip->stream;
      iVar9 = deflate(paVar2,4);
      if (iVar9 == -2) {
        return -0x1e;
      }
      local_48 = (trad_enc_ctx *)aes_ctr_update;
      local_50 = &zip->cctx;
      local_58 = (archive_crypto_ctx *)__hmac_sha1_update;
      local_60 = &zip->hctx;
      while( true ) {
        sVar21 = zip->len_buf - (ulong)(zip->stream).lzma.options.lp;
        if (zip->tctx_valid == '\0') {
          if (zip->cctx_valid != '\0') {
            local_88 = (undefined2)sVar21;
            sStack_86 = (short)(sVar21 >> 0x10);
            uStack_84 = (uint32_t)(sVar21 >> 0x20);
            iVar9 = (*(code *)local_48)(local_50,zip->buf,sVar21,zip->buf,&local_88);
            if (iVar9 < 0) goto LAB_0016a9fe;
            (*(code *)local_58)(local_60,zip->buf,sVar21);
          }
        }
        else {
          trad_enc_encrypt_update(&zip->tctx,zip->buf,sVar21,zip->buf,sVar21);
        }
        iVar9 = __archive_write_output(a,zip->buf,sVar21);
        if (iVar9 != 0) {
          return iVar9;
        }
        zip->entry_compressed_written = zip->entry_compressed_written + sVar21;
        zip->written_bytes = zip->written_bytes + sVar21;
        (zip->stream).deflate.next_out = zip->buf;
        if ((zip->stream).lzma.options.lp != 0) break;
        (zip->stream).lzma.options.lp = (uint32_t)zip->len_buf;
        iVar9 = deflate(paVar2,4);
        if (iVar9 == -2) {
          return -0x1e;
        }
      }
      deflateEnd(paVar2);
    }
    else if (cVar3 == COMPRESSION_LZMA) goto LAB_0016a365;
  }
  else if (cVar3 == COMPRESSION_XZ) {
LAB_0016a365:
    puVar1 = (undefined1 *)((long)&zip->stream + 0x78);
    local_48 = &zip->tctx;
    local_50 = (archive_crypto_ctx *)aes_ctr_update;
    local_58 = &zip->cctx;
    local_60 = (archive_hmac_sha1_ctx *)__hmac_sha1_update;
    local_40 = &zip->hctx;
    do {
      iVar9 = lzma_code(puVar1,3);
      bVar20 = 1;
      if (iVar9 != 1) {
        if (iVar9 == 5) {
          return -0x1e;
        }
        bVar20 = 0;
      }
      sVar21 = zip->len_buf - (zip->stream).lzma.context.avail_out;
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          local_88 = (undefined2)sVar21;
          sStack_86 = (short)(sVar21 >> 0x10);
          uStack_84 = (uint32_t)(sVar21 >> 0x20);
          iVar9 = (*(code *)local_50)(local_58,zip->buf,sVar21,zip->buf,&local_88);
          if (iVar9 < 0) {
LAB_0016a9fe:
            archive_set_error(&a->archive,-1,"Failed to encrypt file");
            return -0x19;
          }
          (*(code *)local_60)(local_40,zip->buf,sVar21);
        }
      }
      else {
        trad_enc_encrypt_update(local_48,zip->buf,sVar21,zip->buf,sVar21);
      }
      iVar9 = __archive_write_output(a,zip->buf,sVar21);
      if (iVar9 != 0) {
        return iVar9;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + sVar21;
      zip->written_bytes = zip->written_bytes + sVar21;
      (zip->stream).lzma.context.next_out = zip->buf;
      sVar21 = (zip->stream).lzma.context.avail_out;
      *(ulong *)((long)&zip->stream + 0x98) = (ulong)(uint)zip->len_buf;
    } while ((bool)(~bVar20 & sVar21 == 0));
    lzma_end(puVar1);
  }
  else if (cVar3 == COMPRESSION_ZSTD) {
    local_48 = &zip->tctx;
    local_50 = (archive_crypto_ctx *)aes_ctr_update;
    local_58 = &zip->cctx;
    local_60 = (archive_hmac_sha1_ctx *)__hmac_sha1_update;
    local_40 = &zip->hctx;
    do {
      lVar13 = ZSTD_endStream((zip->stream).deflate.next_in,
                              (undefined1 *)((long)&zip->stream + 0x20));
      if ((lVar13 != 0) && (iVar9 = ZSTD_isError(lVar13), iVar9 != 0)) {
        return -0x1e;
      }
      pcVar19 = (zip->stream).deflate.msg + (zip->len_buf - (zip->stream).deflate.total_out);
      if (zip->tctx_valid == '\0') {
        if (zip->cctx_valid != '\0') {
          local_88 = SUB82(pcVar19,0);
          sStack_86 = (short)((ulong)pcVar19 >> 0x10);
          uStack_84 = (uint32_t)((ulong)pcVar19 >> 0x20);
          iVar9 = (*(code *)local_50)(local_58,zip->buf,pcVar19,zip->buf,&local_88);
          if (iVar9 < 0) goto LAB_0016a9fe;
          (*(code *)local_60)(local_40,zip->buf,pcVar19);
        }
      }
      else {
        trad_enc_encrypt_update(local_48,zip->buf,(size_t)pcVar19,zip->buf,(size_t)pcVar19);
      }
      iVar9 = __archive_write_output(a,zip->buf,(size_t)pcVar19);
      if (iVar9 != 0) {
        return iVar9;
      }
      zip->entry_compressed_written = (int64_t)(pcVar19 + zip->entry_compressed_written);
      zip->written_bytes = (int64_t)(pcVar19 + zip->written_bytes);
      (zip->stream).zstd.out.dst = zip->buf;
      pcVar19 = (char *)(zip->stream).deflate.total_out;
      (zip->stream).deflate.total_out = zip->len_buf;
    } while ((lVar13 != 0) && ((zip->stream).deflate.msg == pcVar19));
    ZSTD_freeCStream((zip->stream).deflate.next_in);
  }
  if (zip->hctx_valid != '\0') {
    local_38 = 0x14;
    __hmac_sha1_final(&zip->hctx,(uint8_t *)&local_88,&local_38);
    iVar9 = __archive_write_output(a,&local_88,10);
    if (iVar9 != 0) {
      return iVar9;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + 10;
    zip->written_bytes = zip->written_bytes + 10;
  }
  if ((zip->entry_flags & 8) != 0) {
    local_88 = 0x4b50;
    sStack_86 = 0x807;
    if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
      uStack_84 = zip->entry_crc32;
    }
    else {
      uStack_84 = 0;
    }
    lVar13 = zip->entry_compressed_written;
    uVar4 = zip->entry_uncompressed_written;
    uStack_80 = (undefined1)lVar13;
    uStack_7f = (undefined1)((ulong)lVar13 >> 8);
    uStack_7e = (undefined1)((ulong)lVar13 >> 0x10);
    uStack_7d = (undefined1)((ulong)lVar13 >> 0x18);
    if (((long)uVar4 < 0x100000000 && lVar13 < 0x100000000) && ((zip->flags & 2) == 0)) {
      puVar6 = &local_7c;
      puVar7 = &local_7c;
      puVar8 = &local_7c;
      sVar16 = 0x18;
      sVar15 = 0x10;
      sVar14 = 8;
      puVar17 = &local_7c;
      sVar21 = 0x10;
      uVar18 = uVar4;
    }
    else {
      puVar6 = local_74;
      puVar7 = local_74;
      puVar8 = local_74;
      local_7c._0_1_ = (undefined1)((ulong)lVar13 >> 0x20);
      local_7c._1_1_ = (undefined1)((ulong)lVar13 >> 0x28);
      local_7c._2_1_ = (undefined1)((ulong)lVar13 >> 0x30);
      local_7c._3_1_ = (undefined1)((ulong)lVar13 >> 0x38);
      local_7c._4_1_ = (undefined1)uVar4;
      local_7c._5_1_ = (undefined1)(uVar4 >> 8);
      local_7c._6_1_ = (undefined1)(uVar4 >> 0x10);
      local_7c._7_1_ = (undefined1)(uVar4 >> 0x18);
      puVar17 = local_74;
      uVar18 = uVar4 >> 0x20;
      sVar21 = 0x18;
      sVar16 = 0x38;
      sVar15 = 0x30;
      sVar14 = 0x28;
    }
    *(char *)puVar17 = (char)uVar18;
    *(char *)((long)puVar8 + 1) = (char)(uVar4 >> sVar14);
    *(char *)((long)puVar7 + 2) = (char)(uVar4 >> sVar15);
    *(char *)((long)puVar6 + 3) = (char)(uVar4 >> sVar16);
    iVar9 = __archive_write_output(a,&local_88,sVar21);
    zip->written_bytes = zip->written_bytes + sVar21;
    if (iVar9 != 0) {
      return -0x1e;
    }
  }
  wVar10 = archive_entry_mtime_is_set(zip->entry);
  if (wVar10 != L'\0') {
    tVar11 = archive_entry_mtime(zip->entry);
    puVar12 = cd_alloc(zip,9);
    if (puVar12 == (uchar *)0x0) goto LAB_0016a90e;
    puVar12[4] = '\x01';
    puVar12[0] = 'U';
    puVar12[1] = 'T';
    puVar12[2] = '\x05';
    puVar12[3] = '\0';
    *(int *)(puVar12 + 5) = (int)tVar11;
  }
  if ((zip->cctx_valid == '\0') || (zip->aes_vendor != 2)) {
    *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  }
  else {
    puVar12 = zip->file_header;
    puVar12[0x10] = '\0';
    puVar12[0x11] = '\0';
    puVar12[0x12] = '\0';
    puVar12[0x13] = '\0';
  }
  *(int *)(zip->file_header + 0x14) = (int)zip->entry_compressed_written;
  *(int *)(zip->file_header + 0x18) = (int)zip->entry_uncompressed_written;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  *(int *)(zip->file_header + 0x2a) = (int)zip->entry_offset;
  if (zip->entry_compressed_written < 0xffffffff) {
    if (0xfffffffe < zip->entry_uncompressed_written) goto LAB_0016a874;
    if (0xffffffff < zip->entry_offset) {
      puVar22 = &uStack_84;
      goto LAB_0016a8ae;
    }
  }
  else {
    puVar22 = &uStack_84;
    if (zip->entry_uncompressed_written < 0xffffffff) {
LAB_0016a895:
      puVar12 = zip->file_header;
      puVar12[0x14] = 0xff;
      puVar12[0x15] = 0xff;
      puVar12[0x16] = 0xff;
      puVar12[0x17] = 0xff;
      *(int64_t *)puVar22 = zip->entry_compressed_written;
      puVar22 = puVar22 + 2;
    }
    else {
LAB_0016a874:
      puVar12 = zip->file_header;
      puVar12[0x18] = 0xff;
      puVar12[0x19] = 0xff;
      puVar12[0x1a] = 0xff;
      puVar12[0x1b] = 0xff;
      iVar5 = zip->entry_uncompressed_written;
      puVar22 = (uint32_t *)&local_7c;
      uStack_84 = (uint32_t)iVar5;
      uStack_80 = (undefined1)((ulong)iVar5 >> 0x20);
      uStack_7f = (undefined1)((ulong)iVar5 >> 0x28);
      uStack_7e = (undefined1)((ulong)iVar5 >> 0x30);
      uStack_7d = (undefined1)((ulong)iVar5 >> 0x38);
      if (0xfffffffe < zip->entry_compressed_written) goto LAB_0016a895;
    }
LAB_0016a8ae:
    local_88 = 1;
    if (0xfffffffe < zip->entry_offset) {
      puVar12 = zip->file_header;
      puVar12[0x2a] = 0xff;
      puVar12[0x2b] = 0xff;
      puVar12[0x2c] = 0xff;
      puVar12[0x2d] = 0xff;
      *(int64_t *)puVar22 = zip->entry_offset;
      puVar22 = puVar22 + 2;
    }
    sStack_86 = (short)puVar22 - (short)&uStack_84;
    puVar12 = cd_alloc(zip,(long)puVar22 - (long)&local_88);
    if (puVar12 == (uchar *)0x0) {
LAB_0016a90e:
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      return -0x1e;
    }
    memcpy(puVar12,&local_88,(long)puVar22 - (long)&local_88);
    puVar12 = zip->file_header;
    if (*(ushort *)(puVar12 + 6) < 0x2d) {
      puVar12[6] = '-';
      puVar12[7] = '\0';
    }
  }
  if (zip->cctx_valid == '\0') {
    puVar12 = zip->file_header;
  }
  else {
    puVar12 = zip->file_header;
    if (zip->aes_vendor == 2) {
      puVar12[0x10] = '\0';
      puVar12[0x11] = '\0';
      puVar12[0x12] = '\0';
      puVar12[0x13] = '\0';
      goto LAB_0016a97d;
    }
  }
  *(uint32_t *)(puVar12 + 0x10) = zip->entry_crc32;
LAB_0016a97d:
  lVar13 = zip->entry_compressed_written;
  if (0xfffffffe < lVar13) {
    lVar13 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar13;
  lVar13 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar13) {
    lVar13 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar13;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar13 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar13 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar13;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;
#if defined(HAVE_BZLIB_H) || (defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream) || HAVE_LZMA_H
	char finishing;
#endif

	switch (zip->entry_compression) {
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream.deflate, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.deflate.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.deflate.next_out = zip->buf;
			if (zip->stream.deflate.avail_out != 0)
				break;
			zip->stream.deflate.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream.deflate);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		finishing = 1;
		do {
			size_t remainder;

			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_FINISH);
			if (ret == BZ_STREAM_END)
				finishing = 0;
			else if (ret != BZ_RUN_OK && ret != BZ_FINISH_OK)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.bzip2.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.bzip2.next_out = (char*)zip->buf;
			if (zip->stream.bzip2.avail_out != 0)
				finishing = 0;
			zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		BZ2_bzCompressEnd(&zip->stream.bzip2);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		finishing = 1;
		do {
			size_t remainder;

			size_t zret = ZSTD_endStream(zip->stream.zstd.context, &zip->stream.zstd.out);
			if (zret == 0)
				finishing = 0;
			else if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - (zip->stream.zstd.out.size - zip->stream.zstd.out.pos);
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.zstd.out.dst = zip->buf;
			if (zip->stream.zstd.out.pos != zip->stream.zstd.out.size)
				finishing = 0;
			zip->stream.zstd.out.size = zip->len_buf;
		} while (finishing);
		ZSTD_freeCStream(zip->stream.zstd.context);
		break;
#endif
#ifdef HAVE_LZMA_H
	/* XZ and LZMA share clean-up code */
	case COMPRESSION_LZMA:
	case COMPRESSION_XZ:
		finishing = 1;
		do {
			size_t remainder;

			ret = lzma_code(&zip->stream.lzma.context, LZMA_FINISH);
			if (ret == LZMA_STREAM_END)
				finishing = 0;
			else if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.lzma.context.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.lzma.context.next_out = zip->buf;
			if (zip->stream.lzma.context.avail_out != 0)
				finishing = 0;
			zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		lzma_end(&zip->stream.lzma.context);
		break;
#endif
	default:
		break;
	}
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_compressed_written > ZIP_4GB_MAX
		    || zip->entry_uncompressed_written > ZIP_4GB_MAX
		    || zip->flags & ZIP_FLAG_FORCE_ZIP64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* UT timestamp: Info-Zip specifies that _only_ the mtime should
	 * be recorded here; ctime and atime are also included in the
	 * local file descriptor. */
	if (archive_entry_mtime_is_set(zip->entry)) {
		unsigned char ut[9];
		unsigned char *u = ut, *ud;
		memcpy(u, "UT\005\000\001", 5);
		u += 5;
		archive_le32enc(u, (uint32_t)archive_entry_mtime(zip->entry));
		u += 4;
		ud = cd_alloc(zip, u - ut);
		if (ud == NULL) {
			archive_set_error(&a->archive, ENOMEM,
					  "Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(ud, ut, u - ut);
	}

	/* Fill in size information in the central directory entry. */
	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	/* Truncate to 32 bits; we'll fix up below. */
	archive_le32enc(zip->file_header + 20, (uint32_t)zip->entry_compressed_written);
	archive_le32enc(zip->file_header + 24, (uint32_t)zip->entry_uncompressed_written);
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42, (uint32_t)zip->entry_offset);

	/* If any of the values immediately above are too large, we'll
	 * need to put the corresponding value in a Zip64 extra field
	 * and set the central directory value to 0xffffffff as a flag. */
	if (zip->entry_compressed_written >= ZIP_4GB_MAX
	    || zip->entry_uncompressed_written >= ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 24, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 20, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 42, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}